

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

int x86CPUInfo(CPUFeature feature)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint in_XCR0;
  
  piVar1 = (int *)cpuid_basic_info(0);
  iVar3 = *piVar1;
  uVar8 = 0;
  if (0 < iVar3) {
    uVar9 = 0;
    puVar2 = (uint *)cpuid_Version_info(1);
    uVar4 = *puVar2;
    uVar6 = puVar2[3];
    uVar8 = 0;
    switch(feature) {
    case kSSE2:
      uVar8 = puVar2[2] >> 0x1a & 1;
      break;
    case kSlowSSSE3:
      uVar8 = uVar9;
      if (((uVar6 >> 9 & 1) != 0 &&
           (piVar1[2] == 0x49656e69 && (piVar1[3] == 0x6c65746e && piVar1[1] == 0x756e6547))) &&
         ((uVar4 & 0xf00) == 0x600)) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          if ((uVar4 >> 4 & 0xf | uVar4 >> 0xc & 0xf0) ==
              (uint)(byte)(&CheckSlowModel_kSlowModels)[lVar7]) {
            return 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 6);
      }
      break;
    case kSSE4_1:
      uVar6 = uVar6 >> 0x13;
    case kSSE3:
      uVar8 = uVar6 & 1;
      break;
    case kAVX:
      if ((~uVar6 & 0x18000000) == 0) {
        return (uint)((~in_XCR0 & 6) == 0);
      }
      if (feature != kAVX2) {
        return 0;
      }
    case kAVX2:
      iVar5 = x86CPUInfo(kAVX);
      if ((6 < iVar3) && (uVar8 = uVar9, iVar5 != 0)) {
        lVar7 = cpuid_Extended_Feature_Enumeration_info(7);
        uVar8 = *(uint *)(lVar7 + 4) >> 5 & 1;
      }
    }
  }
  return uVar8;
}

Assistant:

static int x86CPUInfo(CPUFeature feature) {
  int max_cpuid_value;
  int cpu_info[4];
  int is_intel = 0;

  // get the highest feature value cpuid supports
  GetCPUInfo(cpu_info, 0);
  max_cpuid_value = cpu_info[0];
  if (max_cpuid_value < 1) {
    return 0;
  } else {
    const int VENDOR_ID_INTEL_EBX = 0x756e6547;  // uneG
    const int VENDOR_ID_INTEL_EDX = 0x49656e69;  // Ieni
    const int VENDOR_ID_INTEL_ECX = 0x6c65746e;  // letn
    is_intel = (cpu_info[1] == VENDOR_ID_INTEL_EBX &&
                cpu_info[2] == VENDOR_ID_INTEL_ECX &&
                cpu_info[3] == VENDOR_ID_INTEL_EDX);    // genuine Intel?
  }

  GetCPUInfo(cpu_info, 1);
  if (feature == kSSE2) {
    return !!(cpu_info[3] & (1 << 26));
  }
  if (feature == kSSE3) {
    return !!(cpu_info[2] & (1 << 0));
  }
  if (feature == kSlowSSSE3) {
    if (is_intel && (cpu_info[2] & (1 << 9))) {   // SSSE3?
      return CheckSlowModel(cpu_info[0]);
    }
    return 0;
  }

  if (feature == kSSE4_1) {
    return !!(cpu_info[2] & (1 << 19));
  }
  if (feature == kAVX) {
    // bits 27 (OSXSAVE) & 28 (256-bit AVX)
    if ((cpu_info[2] & 0x18000000) == 0x18000000) {
      // XMM state and YMM state enabled by the OS.
      return (xgetbv() & 0x6) == 0x6;
    }
  }
  if (feature == kAVX2) {
    if (x86CPUInfo(kAVX) && max_cpuid_value >= 7) {
      GetCPUInfo(cpu_info, 7);
      return !!(cpu_info[1] & (1 << 5));
    }
  }
  return 0;
}